

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_brep_isvalid.cpp
# Opt level: O0

bool __thiscall ON_Brep::IsValidEdgeTopology(ON_Brep *this,int edge_index,ON_TextLog *text_log)

{
  double dVar1;
  double dVar2;
  bool bVar3;
  bool bVar4;
  int iVar5;
  uint uVar6;
  uint uVar7;
  int iVar8;
  ON_BrepEdge *this_00;
  ON_Curve **ppOVar9;
  ON_Curve *pOVar10;
  ON_Curve *pOVar11;
  double *pdVar12;
  ON_BrepVertex *pOVar13;
  int *piVar14;
  uint *puVar15;
  ON_BrepTrim *pOVar16;
  double dVar17;
  ON_BrepTrim *trim;
  uint local_98;
  int ti;
  int eti;
  int i;
  int edge_trim_count;
  int vei;
  bool bFoundIt;
  int vertex_edge_count;
  ON_BrepVertex *vertex;
  int evi;
  int vi1;
  int vi0;
  ON_Interval edge_dom;
  ON_Interval c3_dom;
  ON_Interval proxy_sub_dom;
  int c3i;
  ON_BrepEdge *edge;
  ON_TextLog *text_log_local;
  int edge_index_local;
  ON_Brep *this_local;
  
  if ((edge_index < 0) ||
     (iVar5 = ON_ClassArray<ON_BrepEdge>::Count((ON_ClassArray<ON_BrepEdge> *)&this->m_E),
     iVar5 <= edge_index)) {
    if (text_log != (ON_TextLog *)0x0) {
      uVar6 = ON_ClassArray<ON_BrepEdge>::Count((ON_ClassArray<ON_BrepEdge> *)&this->m_E);
      ON_TextLog::Print(text_log,"brep edge_index = %d (should be >=0 and <%d=brep.m_E.Count() ).\n"
                        ,(ulong)(uint)edge_index,(ulong)uVar6);
    }
    return false;
  }
  this_00 = ON_ClassArray<ON_BrepEdge>::operator[]
                      ((ON_ClassArray<ON_BrepEdge> *)&this->m_E,edge_index);
  if (this_00->m_edge_index != edge_index) {
    if (text_log != (ON_TextLog *)0x0) {
      ON_TextLog::Print(text_log,"brep.m_E[%d] edge is not valid.\n",(ulong)(uint)edge_index);
      ON_TextLog::PushIndent(text_log);
      ON_TextLog::Print(text_log,"edge.m_edge_index = %d (should be %d).\n",
                        (ulong)(uint)this_00->m_edge_index,(ulong)(uint)edge_index);
      ON_TextLog::PopIndent(text_log);
    }
    return false;
  }
  if (this_00->m_brep != this) {
    if (text_log != (ON_TextLog *)0x0) {
      ON_TextLog::Print(text_log,"brep.m_E[%d] edge is not valid.\n",(ulong)(uint)edge_index);
      ON_TextLog::PushIndent(text_log);
      ON_TextLog::Print(text_log,"edge.m_brep does not point to parent brep\n");
      ON_TextLog::PopIndent(text_log);
    }
    return false;
  }
  uVar6 = (*(this_00->super_ON_CurveProxy).super_ON_Curve.super_ON_Geometry.super_ON_Object.
            _vptr_ON_Object[6])(this_00,text_log);
  if ((uVar6 & 1) == 0) {
    if (text_log != (ON_TextLog *)0x0) {
      ON_TextLog::Print(text_log,"brep.m_E[%d] edge is not valid.\n",(ulong)(uint)edge_index);
      ON_TextLog::PushIndent(text_log);
      ON_TextLog::Print(text_log,"edge is not a valid.\n");
      ON_TextLog::PopIndent(text_log);
    }
    return false;
  }
  uVar6 = this_00->m_c3i;
  if (((int)uVar6 < 0) ||
     (iVar5 = ON_SimpleArray<ON_Curve_*>::Count(&(this->m_C3).super_ON_SimpleArray<ON_Curve_*>),
     iVar5 <= (int)uVar6)) {
    if (text_log != (ON_TextLog *)0x0) {
      ON_TextLog::Print(text_log,"brep.m_E[%d] edge is not valid.\n",(ulong)(uint)edge_index);
      ON_TextLog::PushIndent(text_log);
      uVar6 = this_00->m_c3i;
      uVar7 = ON_SimpleArray<ON_Curve_*>::Count(&(this->m_C3).super_ON_SimpleArray<ON_Curve_*>);
      ON_TextLog::Print(text_log,"edge.m_c3i = %d (should be >=0 and <%d=m_C3.Count()\n",
                        (ulong)uVar6,(ulong)uVar7);
      ON_TextLog::PopIndent(text_log);
    }
    return false;
  }
  ppOVar9 = ON_SimpleArray<ON_Curve_*>::operator[]
                      (&(this->m_C3).super_ON_SimpleArray<ON_Curve_*>,uVar6);
  if (*ppOVar9 == (ON_Curve *)0x0) {
    if (text_log != (ON_TextLog *)0x0) {
      ON_TextLog::Print(text_log,"ON_Brep.m_E[%d].m_c3i = %d, but m_C3[%d] is nullptr.\n",
                        (ulong)(uint)edge_index,(ulong)uVar6,(ulong)uVar6);
    }
    return false;
  }
  pOVar10 = ON_CurveProxy::ProxyCurve(&this_00->super_ON_CurveProxy);
  if (pOVar10 == (ON_Curve *)0x0) {
    if (text_log != (ON_TextLog *)0x0) {
      ON_TextLog::Print(text_log,"brep.m_E[%d].m_c3i = %d, but edge.ProxyCurve() is nullptr.\n",
                        (ulong)(uint)edge_index,(ulong)uVar6);
    }
    return false;
  }
  ppOVar9 = ON_SimpleArray<ON_Curve_*>::operator[]
                      (&(this->m_C3).super_ON_SimpleArray<ON_Curve_*>,uVar6);
  pOVar10 = *ppOVar9;
  pOVar11 = ON_CurveProxy::ProxyCurve(&this_00->super_ON_CurveProxy);
  if (pOVar10 != pOVar11) {
    if (text_log != (ON_TextLog *)0x0) {
      ON_TextLog::Print(text_log,"brep.m_E[%d] edge is not valid.\n",(ulong)(uint)edge_index);
      ON_TextLog::PushIndent(text_log);
      ON_TextLog::Print(text_log,"m_E[%d].m_c3i=%d, m_C3[%d] != m_E[%d].ProxyCurve()\n",
                        (ulong)(uint)edge_index,(ulong)uVar6,(ulong)uVar6,(ulong)(uint)edge_index);
      ON_TextLog::PopIndent(text_log);
    }
    return false;
  }
  join_0x00001240_0x00001200_ = ON_CurveProxy::ProxyCurveDomain(&this_00->super_ON_CurveProxy);
  dVar17 = c3_dom._16_8_;
  bVar4 = ON_Interval::IsIncreasing((ON_Interval *)(c3_dom.m_t + 1));
  if (!bVar4) {
    if (text_log != (ON_TextLog *)0x0) {
      ON_TextLog::Print(text_log,"brep.m_E[%d] edge is not valid.\n",(ulong)(uint)edge_index);
      ON_TextLog::PushIndent(text_log);
      pdVar12 = ON_Interval::operator[]((ON_Interval *)(c3_dom.m_t + 1),0);
      dVar17 = *pdVar12;
      pdVar12 = ON_Interval::operator[]((ON_Interval *)(c3_dom.m_t + 1),1);
      ON_TextLog::Print(text_log,"m_E[%d].ProxyCurveDomain() = (%g,%g) is not increasing\n",dVar17,
                        *pdVar12,(ulong)(uint)edge_index);
      ON_TextLog::PopIndent(text_log);
    }
    return false;
  }
  ppOVar9 = ON_SimpleArray<ON_Curve_*>::operator[]
                      (&(this->m_C3).super_ON_SimpleArray<ON_Curve_*>,uVar6);
  (*((*ppOVar9)->super_ON_Geometry).super_ON_Object._vptr_ON_Object[0x25])();
  c3_dom.m_t[0] = dVar17;
  bVar4 = ON_Interval::Includes
                    ((ON_Interval *)(edge_dom.m_t + 1),(ON_Interval *)(c3_dom.m_t + 1),false);
  if (!bVar4) {
    if (text_log != (ON_TextLog *)0x0) {
      ON_TextLog::Print(text_log,"brep.m_E[%d] edge is not valid.\n",(ulong)(uint)edge_index);
      ON_TextLog::PushIndent(text_log);
      pdVar12 = ON_Interval::operator[]((ON_Interval *)(edge_dom.m_t + 1),0);
      dVar17 = *pdVar12;
      pdVar12 = ON_Interval::operator[]((ON_Interval *)(edge_dom.m_t + 1),1);
      dVar1 = *pdVar12;
      pdVar12 = ON_Interval::operator[]((ON_Interval *)(c3_dom.m_t + 1),0);
      dVar2 = *pdVar12;
      pdVar12 = ON_Interval::operator[]((ON_Interval *)(c3_dom.m_t + 1),1);
      ON_TextLog::Print(text_log,
                        "m_C3[%d].Domain() = (%g,%g) does not inlclude m_E[%d].ProxyCurveDomain() = (%g,%g) is not increasing\n"
                        ,dVar17,dVar1,dVar2,*pdVar12,(ulong)uVar6,(ulong)(uint)edge_index);
      ON_TextLog::PopIndent(text_log);
    }
    return false;
  }
  (*(this_00->super_ON_CurveProxy).super_ON_Curve.super_ON_Geometry.super_ON_Object._vptr_ON_Object
    [0x25])();
  edge_dom.m_t[0] = dVar17;
  bVar4 = ON_Interval::IsIncreasing((ON_Interval *)&vi1);
  if (!bVar4) {
    if (text_log != (ON_TextLog *)0x0) {
      ON_TextLog::Print(text_log,"brep.m_E[%d] trim is not valid.\n",(ulong)(uint)edge_index);
      ON_TextLog::PushIndent(text_log);
      pdVar12 = ON_Interval::operator[]((ON_Interval *)&vi1,0);
      dVar17 = *pdVar12;
      pdVar12 = ON_Interval::operator[]((ON_Interval *)&vi1,1);
      ON_TextLog::Print(text_log,"m_E[%d].Domain() = (%g,%g) is not increasing\n",dVar17,*pdVar12,
                        (ulong)(uint)edge_index);
      ON_TextLog::PopIndent(text_log);
    }
    return false;
  }
  uVar6 = this_00->m_vi[0];
  uVar7 = this_00->m_vi[1];
  if (((int)uVar6 < 0) ||
     (iVar5 = ON_ClassArray<ON_BrepVertex>::Count((ON_ClassArray<ON_BrepVertex> *)&this->m_V),
     iVar5 <= (int)uVar6)) {
    if (text_log != (ON_TextLog *)0x0) {
      ON_TextLog::Print(text_log,"brep.m_E[%d] edge is not valid.\n",(ulong)(uint)edge_index);
      ON_TextLog::PushIndent(text_log);
      uVar7 = ON_ClassArray<ON_BrepVertex>::Count((ON_ClassArray<ON_BrepVertex> *)&this->m_V);
      ON_TextLog::Print(text_log,"edge.m_vi[0]=%d (should be >=0 and <%d=m_V.Count()\n",(ulong)uVar6
                        ,(ulong)uVar7);
      ON_TextLog::PopIndent(text_log);
    }
    return false;
  }
  if ((-1 < (int)uVar7) &&
     (iVar5 = ON_ClassArray<ON_BrepVertex>::Count((ON_ClassArray<ON_BrepVertex> *)&this->m_V),
     (int)uVar7 < iVar5)) {
    for (vertex._4_4_ = 0; (int)vertex._4_4_ < 2; vertex._4_4_ = vertex._4_4_ + 1) {
      pOVar13 = ON_ClassArray<ON_BrepVertex>::operator[]
                          ((ON_ClassArray<ON_BrepVertex> *)&this->m_V,
                           this_00->m_vi[(int)vertex._4_4_]);
      if (this_00->m_vi[(int)vertex._4_4_] != pOVar13->m_vertex_index) {
        if (text_log != (ON_TextLog *)0x0) {
          ON_TextLog::Print(text_log,"brep.m_E[%d] edge is not valid.\n",(ulong)(uint)edge_index);
          ON_TextLog::PushIndent(text_log);
          ON_TextLog::Print(text_log,"edge.m_vi[%d]=%d is a deleted vertex\n",(ulong)vertex._4_4_,
                            (ulong)(uint)this_00->m_vi[(int)vertex._4_4_]);
          ON_TextLog::PopIndent(text_log);
        }
        return false;
      }
      iVar5 = ON_SimpleArray<int>::Count(&pOVar13->m_ei);
      bVar4 = false;
      i = 0;
      while( true ) {
        bVar3 = false;
        if (i < iVar5) {
          bVar3 = (bool)(bVar4 ^ 1);
        }
        if (!bVar3) break;
        piVar14 = ON_SimpleArray<int>::operator[](&pOVar13->m_ei,i);
        bVar4 = *piVar14 == edge_index;
        i = i + 1;
      }
      if (!bVar4) {
        if (text_log != (ON_TextLog *)0x0) {
          ON_TextLog::Print(text_log,"brep.m_E[%d] edge is not valid.\n",(ulong)(uint)edge_index);
          ON_TextLog::PushIndent(text_log);
          ON_TextLog::Print(text_log,
                            "edge.m_vi[%d]=%d but edge is not referenced in m_V[%d].m_ei[]\n",
                            (ulong)vertex._4_4_,(ulong)(uint)this_00->m_vi[(int)vertex._4_4_],
                            (ulong)(uint)this_00->m_vi[(int)vertex._4_4_]);
          ON_TextLog::PopIndent(text_log);
        }
        return false;
      }
    }
    iVar5 = ON_SimpleArray<int>::Count(&this_00->m_ti);
    if (iVar5 < 0) {
      if (text_log != (ON_TextLog *)0x0) {
        ON_TextLog::Print(text_log,"brep.m_E[%d] edge is not valid.\n",(ulong)(uint)edge_index);
        ON_TextLog::PushIndent(text_log);
        ON_TextLog::Print(text_log,"edge.m_ti.Count() < 0\n");
        ON_TextLog::PopIndent(text_log);
      }
      return false;
    }
    local_98 = 0;
    while( true ) {
      if (iVar5 <= (int)local_98) {
        return true;
      }
      puVar15 = (uint *)ON_SimpleArray<int>::operator[](&this_00->m_ti,local_98);
      uVar6 = *puVar15;
      if (((int)uVar6 < 0) ||
         (iVar8 = ON_ClassArray<ON_BrepTrim>::Count((ON_ClassArray<ON_BrepTrim> *)&this->m_T),
         iVar8 <= (int)uVar6)) {
        if (text_log != (ON_TextLog *)0x0) {
          ON_TextLog::Print(text_log,"brep.m_E[%d] edge is not valid.\n",(ulong)(uint)edge_index);
          ON_TextLog::PushIndent(text_log);
          ON_TextLog::Print(text_log,"edge.m_ti[%d]=%d (should be >=0 and <%d=m_T.Count())\n",
                            (ulong)local_98,(ulong)uVar6);
          ON_TextLog::PopIndent(text_log);
        }
        return false;
      }
      pOVar16 = ON_ClassArray<ON_BrepTrim>::operator[]
                          ((ON_ClassArray<ON_BrepTrim> *)&this->m_T,uVar6);
      if (pOVar16->m_trim_index != uVar6) {
        if (text_log != (ON_TextLog *)0x0) {
          ON_TextLog::Print(text_log,"brep.m_E[%d] edge is not valid.\n",(ulong)(uint)edge_index);
          ON_TextLog::PushIndent(text_log);
          ON_TextLog::Print(text_log,"edge.m_ti[%d]=%d is a deleted trim\n",(ulong)local_98,
                            (ulong)uVar6);
          ON_TextLog::PopIndent(text_log);
        }
        return false;
      }
      for (ti = 0; ti < (int)local_98; ti = ti + 1) {
        puVar15 = (uint *)ON_SimpleArray<int>::operator[](&this_00->m_ti,ti);
        if (*puVar15 == uVar6) {
          if (text_log != (ON_TextLog *)0x0) {
            ON_TextLog::Print(text_log,"brep.m_E[%d] edge is not valid.\n",(ulong)(uint)edge_index);
            ON_TextLog::PushIndent(text_log);
            ON_TextLog::Print(text_log,
                              "edge.m_ti[%d]=edge.m_ti[%d]=%d (a trim should be referenced once).\n"
                              ,(ulong)(uint)ti,(ulong)local_98,(ulong)uVar6);
            ON_TextLog::PopIndent(text_log);
          }
          return false;
        }
      }
      pOVar16 = ON_ClassArray<ON_BrepTrim>::operator[]
                          ((ON_ClassArray<ON_BrepTrim> *)&this->m_T,uVar6);
      if (pOVar16->m_ei != edge_index) break;
      local_98 = local_98 + 1;
    }
    if (text_log != (ON_TextLog *)0x0) {
      ON_TextLog::Print(text_log,"brep.m_E[%d] edge is not valid.\n",(ulong)(uint)edge_index);
      ON_TextLog::PushIndent(text_log);
      ON_TextLog::Print(text_log,"edge.m_ti[%d]=%d but brep.m_T[%d].m_ei=%d\n",(ulong)local_98,
                        (ulong)uVar6,(ulong)uVar6,(ulong)(uint)pOVar16->m_ei);
      ON_TextLog::PopIndent(text_log);
    }
    return false;
  }
  if (text_log != (ON_TextLog *)0x0) {
    ON_TextLog::Print(text_log,"brep.m_E[%d] edge is not valid.\n",(ulong)(uint)edge_index);
    ON_TextLog::PushIndent(text_log);
    uVar6 = ON_ClassArray<ON_BrepVertex>::Count((ON_ClassArray<ON_BrepVertex> *)&this->m_V);
    ON_TextLog::Print(text_log,"edge.m_vi[1]=%d (should be >=0 and <%d=m_V.Count()\n",(ulong)uVar7,
                      (ulong)uVar6);
    ON_TextLog::PopIndent(text_log);
  }
  return false;
}

Assistant:

bool
ON_Brep::IsValidEdgeTopology( int edge_index, ON_TextLog* text_log ) const
{
  if ( edge_index < 0 || edge_index >= m_E.Count() )
  {
    if ( text_log )
      text_log->Print("brep edge_index = %d (should be >=0 and <%d=brep.m_E.Count() ).\n",
                      edge_index, m_E.Count());
    return false;
  }
  const ON_BrepEdge& edge = m_E[edge_index];
  if ( edge.m_edge_index != edge_index )
  {
    if ( text_log )
    {
      text_log->Print("brep.m_E[%d] edge is not valid.\n",edge_index);
      text_log->PushIndent();
      text_log->Print("edge.m_edge_index = %d (should be %d).\n",
                       edge.m_edge_index, edge_index );
      text_log->PopIndent();
    }
    return false;
  }
  if ( edge.m_brep != this )
  {
    if ( text_log )
    {
      text_log->Print("brep.m_E[%d] edge is not valid.\n",edge_index);
      text_log->PushIndent();
      text_log->Print("edge.m_brep does not point to parent brep\n");
      text_log->PopIndent();
    }
    return false;
  }

  if ( !edge.IsValid(text_log) )
  {
    if ( text_log )
    {
      text_log->Print("brep.m_E[%d] edge is not valid.\n",edge_index);
      text_log->PushIndent();
      text_log->Print("edge is not a valid.\n");
      text_log->PopIndent();
    }
    return false;
  }

  // This checks to make sure that m_C3[] and the edge's proxy information is valid.
  // This isn't exactly "topology", but if this stuff isn't set right, then the
  // "geometry" checks might crash.

  const int c3i = edge.m_c3i;
  if ( c3i < 0 || c3i >= m_C3.Count() )
  {
    if ( text_log )
    {
      text_log->Print("brep.m_E[%d] edge is not valid.\n",edge_index);
      text_log->PushIndent();
      text_log->Print("edge.m_c3i = %d (should be >=0 and <%d=m_C3.Count()\n",
                      edge.m_c3i,m_C3.Count() );
      text_log->PopIndent();
    }
    return false;
  }
  
  if ( 0 == m_C3[c3i] )
  {
    if ( text_log )
      text_log->Print("ON_Brep.m_E[%d].m_c3i = %d, but m_C3[%d] is nullptr.\n",edge_index,c3i,c3i);
    return false;
  }

  if ( 0 == edge.ProxyCurve() )
  {
    if ( text_log )
      text_log->Print("brep.m_E[%d].m_c3i = %d, but edge.ProxyCurve() is nullptr.\n",edge_index,c3i);
    return false;
  }

  if ( m_C3[c3i] != edge.ProxyCurve() )
  {
    if ( text_log )
    {
      text_log->Print("brep.m_E[%d] edge is not valid.\n",edge_index);
      text_log->PushIndent();
      text_log->Print("m_E[%d].m_c3i=%d, m_C3[%d] != m_E[%d].ProxyCurve()\n",edge_index,c3i,c3i,edge_index);
      text_log->PopIndent();
    }
    return false;
  }

  ON_Interval proxy_sub_dom = edge.ProxyCurveDomain();
  if ( !proxy_sub_dom.IsIncreasing() )
  {
    if ( text_log )
    {
      text_log->Print("brep.m_E[%d] edge is not valid.\n",edge_index);
      text_log->PushIndent();
      text_log->Print("m_E[%d].ProxyCurveDomain() = (%g,%g) is not increasing\n",edge_index,proxy_sub_dom[0],proxy_sub_dom[1]);
      text_log->PopIndent();
    }
    return false;
  }

  ON_Interval c3_dom = m_C3[c3i]->Domain();
  if ( !c3_dom.Includes(proxy_sub_dom) )
  {
    if ( text_log )
    {
      text_log->Print("brep.m_E[%d] edge is not valid.\n",edge_index);
      text_log->PushIndent();
      text_log->Print("m_C3[%d].Domain() = (%g,%g) does not inlclude m_E[%d].ProxyCurveDomain() = (%g,%g) is not increasing\n",
                      c3i,c3_dom[0],c3_dom[1],edge_index,proxy_sub_dom[0],proxy_sub_dom[1]);
      text_log->PopIndent();
    }
    return false;
  }

  ON_Interval edge_dom = edge.Domain();
  if ( !edge_dom.IsIncreasing() )
  {
    if ( text_log )
    {
      text_log->Print("brep.m_E[%d] trim is not valid.\n",edge_index);
      text_log->PushIndent();
      text_log->Print("m_E[%d].Domain() = (%g,%g) is not increasing\n",edge_index,edge_dom[0],edge_dom[1]);
      text_log->PopIndent();
    }
    return false;
  }



  const int vi0 = edge.m_vi[0];
  const int vi1 = edge.m_vi[1];
  if ( vi0 < 0 || vi0 >= m_V.Count() )
  {
    if ( text_log )
    {
      text_log->Print("brep.m_E[%d] edge is not valid.\n",edge_index);
      text_log->PushIndent();
      text_log->Print("edge.m_vi[0]=%d (should be >=0 and <%d=m_V.Count()\n",
                       vi0, m_V.Count() );
      text_log->PopIndent();
    }
    return false;
  }
  if ( vi1 < 0 || vi1 >= m_V.Count() )
  {
    if ( text_log )
    {
      text_log->Print("brep.m_E[%d] edge is not valid.\n",edge_index);
      text_log->PushIndent();
      text_log->Print("edge.m_vi[1]=%d (should be >=0 and <%d=m_V.Count()\n",
                       vi1, m_V.Count() );
      text_log->PopIndent();
    }
    return false;
  }
  int evi;
  for ( evi = 0; evi < 2; evi++ ) 
  {
    const ON_BrepVertex& vertex = m_V[edge.m_vi[evi]];

    if ( edge.m_vi[evi] != vertex.m_vertex_index )
    {
      if ( text_log )
      {
        text_log->Print("brep.m_E[%d] edge is not valid.\n",edge_index);
        text_log->PushIndent();
        text_log->Print("edge.m_vi[%d]=%d is a deleted vertex\n",
                         evi,edge.m_vi[evi] );
        text_log->PopIndent();
      }
      return false;
    }


    const int vertex_edge_count = vertex.m_ei.Count();
    bool bFoundIt = false;
    int vei;
    for ( vei = 0; vei < vertex_edge_count && !bFoundIt; vei++ ) 
    {
      bFoundIt = (vertex.m_ei[vei] == edge_index);
    }
    if ( !bFoundIt )
    {
      if ( text_log )
      {
        text_log->Print("brep.m_E[%d] edge is not valid.\n",edge_index);
        text_log->PushIndent();
        text_log->Print("edge.m_vi[%d]=%d but edge is not referenced in m_V[%d].m_ei[]\n",
                         evi,edge.m_vi[evi],edge.m_vi[evi] );
        text_log->PopIndent();
      }
      return false;
    }
  }

  const int edge_trim_count = edge.m_ti.Count();
  if ( edge_trim_count < 0 )
  {
    if ( text_log )
    {
      text_log->Print("brep.m_E[%d] edge is not valid.\n",edge_index);
      text_log->PushIndent();
      text_log->Print("edge.m_ti.Count() < 0\n");
      text_log->PopIndent();
    }
    return false;
  }
  int i, eti, ti;
  for (eti = 0; eti < edge_trim_count; eti++ )
  {
    ti = edge.m_ti[eti];
    if ( ti < 0 || ti >= m_T.Count() )
    {
      if ( text_log )
      {
        text_log->Print("brep.m_E[%d] edge is not valid.\n",edge_index);
        text_log->PushIndent();
        text_log->Print("edge.m_ti[%d]=%d (should be >=0 and <%d=m_T.Count())\n",eti,ti);
        text_log->PopIndent();
      }
      return false;
    }
    if ( m_T[ti].m_trim_index != ti )
    {
      if ( text_log )
      {
        text_log->Print("brep.m_E[%d] edge is not valid.\n",edge_index);
        text_log->PushIndent();
        text_log->Print("edge.m_ti[%d]=%d is a deleted trim\n",eti,ti);
        text_log->PopIndent();
      }
      return false;
    }
    for ( i = 0; i < eti; i++ ) 
    {
      if ( edge.m_ti[i] == ti )
      {
        if ( text_log )
        {
          text_log->Print("brep.m_E[%d] edge is not valid.\n",edge_index);
          text_log->PushIndent();
          text_log->Print("edge.m_ti[%d]=edge.m_ti[%d]=%d (a trim should be referenced once).\n",i,eti,ti);
          text_log->PopIndent();
        }
        return false;
      }
    }
    const ON_BrepTrim& trim = m_T[ti];
    if ( trim.m_ei != edge_index )
    {
      if ( text_log )
      {
        text_log->Print("brep.m_E[%d] edge is not valid.\n",edge_index);
        text_log->PushIndent();
        text_log->Print("edge.m_ti[%d]=%d but brep.m_T[%d].m_ei=%d\n",eti,ti,ti,trim.m_ei);
        text_log->PopIndent();
      }
      return false;
    }
  }

  return true;
}